

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

Chainstate * __thiscall
ChainstateManager::ActivateExistingSnapshot(ChainstateManager *this,uint256 base_blockhash)

{
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *this_00;
  _Head_base<0UL,_Chainstate_*,_false> __ptr;
  Chainstate *pCVar1;
  optional<uint256> from_snapshot_blockhash;
  uint256 uVar2;
  _Head_base<0UL,_Chainstate_*,_false> this_01;
  unsigned_long uVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  string local_58;
  undefined1 local_38;
  long local_28;
  
  uVar2.super_base_blob<256U>.m_data._M_elems = base_blockhash.super_base_blob<256U>.m_data._M_elems
  ;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_snapshot_chainstate)._M_t.
      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) {
    __assert_fail("!m_snapshot_chainstate",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x1892,"Chainstate &ChainstateManager::ActivateExistingSnapshot(uint256)");
  }
  this_01._M_head_impl = (Chainstate *)operator_new(0xe8);
  local_58._M_dataplus._M_p = (pointer)base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_;
  local_58._M_string_length._0_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[8];
  local_58._M_string_length._1_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[9];
  local_58._M_string_length._2_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[10];
  local_58._M_string_length._3_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
  local_58._M_string_length._4_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
  local_58._M_string_length._5_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
  local_58._M_string_length._6_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
  local_58._M_string_length._7_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
  local_58.field_2._M_local_buf[0] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x10];
  local_58.field_2._M_local_buf[1] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x11];
  local_58.field_2._M_local_buf[2] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x12];
  local_58.field_2._M_local_buf[3] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x13];
  local_58.field_2._M_local_buf[4] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x14];
  local_58.field_2._M_local_buf[5] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x15];
  local_58.field_2._M_local_buf[6] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x16];
  local_58.field_2._M_local_buf[7] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x17];
  local_58.field_2._M_local_buf[8] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x18];
  local_58.field_2._M_local_buf[9] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x19];
  local_58.field_2._M_local_buf[10] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_58.field_2._M_local_buf[0xb] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_58.field_2._M_local_buf[0xc] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_58.field_2._M_local_buf[0xd] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_58.field_2._M_local_buf[0xe] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_58.field_2._M_local_buf[0xf] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_38 = 1;
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = true;
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.m_data._M_elems =
       (uint256)(uint256)uVar2.super_base_blob<256U>.m_data._M_elems;
  Chainstate::Chainstate
            (this_01._M_head_impl,(CTxMemPool *)0x0,&this->m_blockman,this,from_snapshot_blockhash);
  this_00 = &this->m_snapshot_chainstate;
  __ptr._M_head_impl =
       (this_00->_M_t).super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  (this_00->_M_t).super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = this_01._M_head_impl;
  if (__ptr._M_head_impl != (Chainstate *)0x0) {
    std::default_delete<Chainstate>::operator()
              ((default_delete<Chainstate> *)this_00,__ptr._M_head_impl);
    this_01._M_head_impl =
         (this_00->_M_t).super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  }
  Chainstate::ToString_abi_cxx11_(&local_58,this_01._M_head_impl);
  logging_function._M_str = "ActivateExistingSnapshot";
  logging_function._M_len = 0x18;
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
  source_file._M_len = 0x57;
  ::LogPrintf_<std::__cxx11::string>
            (logging_function,source_file,0x1895,ALL,Info,
             "[snapshot] switching active chainstate to %s\n",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  uVar3 = CTxMemPool::size(this->m_active_chainstate->m_mempool);
  local_58._M_dataplus._M_p._0_1_ = uVar3 == 0;
  inline_assertion_check<true,bool>
            ((bool *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0x1898,"ActivateExistingSnapshot","m_active_chainstate->m_mempool->size() == 0");
  local_58._M_dataplus._M_p._0_1_ =
       ((this->m_snapshot_chainstate)._M_t.
        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool == (CTxMemPool *)0x0;
  inline_assertion_check<true,bool>
            ((bool *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0x1899,"ActivateExistingSnapshot","!m_snapshot_chainstate->m_mempool");
  pCVar1 = this->m_active_chainstate;
  ((this->m_snapshot_chainstate)._M_t.
   super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
   super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
   super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool = pCVar1->m_mempool;
  pCVar1->m_mempool = (CTxMemPool *)0x0;
  pCVar1 = (this->m_snapshot_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  this->m_active_chainstate = pCVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pCVar1;
  }
  __stack_chk_fail();
}

Assistant:

Chainstate& ChainstateManager::ActivateExistingSnapshot(uint256 base_blockhash)
{
    assert(!m_snapshot_chainstate);
    m_snapshot_chainstate =
        std::make_unique<Chainstate>(nullptr, m_blockman, *this, base_blockhash);
    LogPrintf("[snapshot] switching active chainstate to %s\n", m_snapshot_chainstate->ToString());

    // Mempool is empty at this point because we're still in IBD.
    Assert(m_active_chainstate->m_mempool->size() == 0);
    Assert(!m_snapshot_chainstate->m_mempool);
    m_snapshot_chainstate->m_mempool = m_active_chainstate->m_mempool;
    m_active_chainstate->m_mempool = nullptr;
    m_active_chainstate = m_snapshot_chainstate.get();
    return *m_snapshot_chainstate;
}